

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

void Io_MvFree(Io_MvMan_t *p)

{
  void *__ptr;
  void *pvVar1;
  void *pvVar2;
  void **ppvVar3;
  Vec_Str_t *__ptr_00;
  char *__ptr_01;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  if (p->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(p->pDesign,(Abc_Ntk_t *)0x0);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  pVVar5 = p->vLines;
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
  }
  pVVar5 = p->vModels;
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar5->nSize) {
      lVar4 = 0;
      do {
        __ptr = pVVar5->pArray[lVar4];
        pvVar1 = *(void **)((long)__ptr + 0x60);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 8);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x10);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x18);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x20);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x28);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x30);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x38);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x40);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x48);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x50);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        pvVar1 = *(void **)((long)__ptr + 0x58);
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        free(__ptr);
        lVar4 = lVar4 + 1;
        pVVar5 = p->vModels;
      } while (lVar4 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
  }
  pVVar5 = p->vTokens;
  ppvVar3 = pVVar5->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar5);
  pVVar5 = p->vTokens2;
  ppvVar3 = pVVar5->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar5);
  __ptr_00 = p->vFunc;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (char *)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

static void Io_MvFree( Io_MvMan_t * p )
{
    Io_MvMod_t * pMod;
    int i;
    if ( p->pDesign )
        Abc_DesFree( p->pDesign, NULL );
    if ( p->pBuffer )  
        ABC_FREE( p->pBuffer );
    if ( p->vLines )
        Vec_PtrFree( p->vLines  );
    if ( p->vModels )
    {
        Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
            Io_MvModFree( pMod );
        Vec_PtrFree( p->vModels );
    }
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vTokens2 );
    Vec_StrFree( p->vFunc );
    ABC_FREE( p );
}